

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_to_local_pass.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::PrivateToLocalPass::GetNewType(PrivateToLocalPass *this,uint32_t old_type_id)

{
  uint32_t uVar1;
  IRContext *pIVar2;
  TypeManager *this_00;
  DefUseManager *pDVar3;
  Instruction *pIVar4;
  IRContext *this_01;
  uint32_t new_type_id;
  uint32_t pointee_type_id;
  Instruction *old_type_inst;
  TypeManager *type_mgr;
  uint32_t old_type_id_local;
  PrivateToLocalPass *this_local;
  
  pIVar2 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_type_mgr(pIVar2);
  pDVar3 = Pass::get_def_use_mgr(&this->super_Pass);
  pIVar4 = analysis::DefUseManager::GetDef(pDVar3,old_type_id);
  uVar1 = opt::Instruction::GetSingleWordInOperand(pIVar4,1);
  uVar1 = analysis::TypeManager::FindPointerToType(this_00,uVar1,Function);
  if (uVar1 != 0) {
    pIVar2 = Pass::context(&this->super_Pass);
    this_01 = Pass::context(&this->super_Pass);
    pDVar3 = IRContext::get_def_use_mgr(this_01);
    pIVar4 = analysis::DefUseManager::GetDef(pDVar3,uVar1);
    IRContext::UpdateDefUse(pIVar2,pIVar4);
  }
  return uVar1;
}

Assistant:

uint32_t PrivateToLocalPass::GetNewType(uint32_t old_type_id) {
  auto type_mgr = context()->get_type_mgr();
  Instruction* old_type_inst = get_def_use_mgr()->GetDef(old_type_id);
  uint32_t pointee_type_id =
      old_type_inst->GetSingleWordInOperand(kSpvTypePointerTypeIdInIdx);
  uint32_t new_type_id =
      type_mgr->FindPointerToType(pointee_type_id, spv::StorageClass::Function);
  if (new_type_id != 0) {
    context()->UpdateDefUse(context()->get_def_use_mgr()->GetDef(new_type_id));
  }
  return new_type_id;
}